

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O1

err_t SetBlockParent(matroska_block *Block,void *Parent,void *Before)

{
  bool_t bVar1;
  mkv_timestamp_t Timestamp;
  mkv_timestamp_t ClusterTimestamp;
  err_t eVar2;
  void *pvVar3;
  
  eVar2 = 0;
  if ((Parent != (void *)0x0) && (Block->LocalTimestampUsed != 0)) {
    if ((Block->Base).Base.Base.Parent == (nodetree *)0x0) {
      eVar2 = 0;
    }
    else {
      bVar1 = Node_IsPartOf(Parent,0x55434b4d);
      if (bVar1 == 0) {
        __assert_fail("Node_IsPartOf(Parent,MATROSKA_CLUSTER_CLASS)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x53b,"err_t SetBlockParent(matroska_block *, void *, void *)");
      }
      Timestamp = MATROSKA_BlockTimestamp(Block);
      if (Timestamp == 0x7fffffffffffffff) {
        __assert_fail("AbsTimestamp != INVALID_TIMESTAMP_T",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x53d,"err_t SetBlockParent(matroska_block *, void *, void *)");
      }
      ClusterTimestamp = MATROSKA_ClusterTimestamp((matroska_cluster *)Parent);
      eVar2 = MATROSKA_BlockSetTimestamp(Block,Timestamp,ClusterTimestamp);
    }
  }
  if (eVar2 != 0) {
    return eVar2;
  }
  pvVar3 = Node_InheritedVMT((node *)Block,0x4c424b4d);
  eVar2 = (**(code **)((long)pvVar3 + 0x48))(Block,Parent,Before);
  return eVar2;
}

Assistant:

static err_t SetBlockParent(matroska_block *Block, void* Parent, void* Before)
{
    // update the timestamp
    mkv_timestamp_t AbsTimestamp;
    err_t Result = ERR_NONE;
    if (Block->LocalTimestampUsed && Parent && NodeTree_Parent(Block))
    {
        assert(Node_IsPartOf(Parent,MATROSKA_CLUSTER_CLASS));
        AbsTimestamp = MATROSKA_BlockTimestamp(Block);
        assert(AbsTimestamp != INVALID_TIMESTAMP_T);
        Result = MATROSKA_BlockSetTimestamp(Block,AbsTimestamp,MATROSKA_ClusterTimestamp((matroska_cluster*)Parent));
    }
    if (Result==ERR_NONE)
        Result = INHERITED(Block,nodetree_vmt,MATROSKA_BLOCK_CLASS)->SetParent(Block, Parent, Before);
    return Result;
}